

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void Qentem::TestOutPut::
     Print<char_const*,char[2],unsigned_long,char[10],char_const*,char[9],char16_t[31],char[19],Qentem::StringStream<char16_t>,char[4]>
               (char **values,char (*values_1) [2],unsigned_long *values_2,char (*values_3) [10],
               char **values_4,char (*values_5) [9],char16_t (*values_6) [31],char (*values_7) [19],
               StringStream<char16_t> *values_8,char (*values_9) [4])

{
  char16_t *pcVar1;
  wostream *pwVar2;
  ulong uVar3;
  
  if (GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar2 = std::operator<<((wostream *)&std::wcout,*values);
    pwVar2 = std::operator<<(pwVar2,*values_1);
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    pwVar2 = std::operator<<(pwVar2,*values_3);
    pwVar2 = std::operator<<(pwVar2,*values_4);
    pwVar2 = std::operator<<(pwVar2,*values_5);
    pwVar2 = std::wostream::_M_insert<void_const*>(pwVar2);
    pwVar2 = std::operator<<(pwVar2,*values_7);
    if (values_8->length_ != 0) {
      pcVar1 = values_8->storage_;
      uVar3 = 0;
      do {
        std::wostream::operator<<(pwVar2,(uint)(ushort)pcVar1[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < values_8->length_);
    }
  }
  else {
    pwVar2 = std::operator<<((wostream *)(GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10),
                             *values);
    pwVar2 = std::operator<<(pwVar2,*values_1);
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    pwVar2 = std::operator<<(pwVar2,*values_3);
    pwVar2 = std::operator<<(pwVar2,*values_4);
    pwVar2 = std::operator<<(pwVar2,*values_5);
    pwVar2 = std::wostream::_M_insert<void_const*>(pwVar2);
    pwVar2 = std::operator<<(pwVar2,*values_7);
    if (values_8->length_ != 0) {
      pcVar1 = values_8->storage_;
      uVar3 = 0;
      do {
        std::wostream::operator<<(pwVar2,(uint)(ushort)pcVar1[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < values_8->length_);
    }
  }
  std::operator<<(pwVar2,*values_9);
  return;
}

Assistant:

inline static void Print(const Values_T &...values) {
        if (GetStreamCache() == nullptr) {
#if __cplusplus > 201402L
            (std::wcout << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {(std::wcout << values, 0)...};
            (void)dummy;
#endif

        } else {
#if __cplusplus > 201402L
            ((*GetStreamCache()) << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {((*GetStreamCache()) << values, 0)...};
            (void)dummy;
#endif
        }
    }